

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  Type *value_00;
  Type *value_local;
  RepeatedPtrFieldBase *this_local;
  
  if (this->current_size_ == this->total_size_) {
    Reserve(this,this->total_size_ + 1);
    this->allocated_size_ = this->allocated_size_ + 1;
  }
  else if (this->allocated_size_ == this->total_size_) {
    value_00 = cast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                         (this->elements_[this->current_size_]);
    GenericTypeHandler<google::protobuf::Message>::Delete(value_00);
  }
  else if (this->current_size_ < this->allocated_size_) {
    this->elements_[this->allocated_size_] = this->elements_[this->current_size_];
    this->allocated_size_ = this->allocated_size_ + 1;
  }
  else {
    this->allocated_size_ = this->allocated_size_ + 1;
  }
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  this->elements_[iVar1] = value;
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocated(
    typename TypeHandler::Type* value) {
  // Make room for the new pointer.
  if (current_size_ == total_size_) {
    // The array is completely full with no cleared objects, so grow it.
    Reserve(total_size_ + 1);
    ++allocated_size_;
  } else if (allocated_size_ == total_size_) {
    // There is no more space in the pointer array because it contains some
    // cleared objects awaiting reuse.  We don't want to grow the array in this
    // case because otherwise a loop calling AddAllocated() followed by Clear()
    // would leak memory.
    TypeHandler::Delete(cast<TypeHandler>(elements_[current_size_]));
  } else if (current_size_ < allocated_size_) {
    // We have some cleared objects.  We don't care about their order, so we
    // can just move the first one to the end to make space.
    elements_[allocated_size_] = elements_[current_size_];
    ++allocated_size_;
  } else {
    // There are no cleared objects.
    ++allocated_size_;
  }

  elements_[current_size_++] = value;
}